

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

int process_aggregate_arg
              (c2m_ctx_t c2m_ctx,type *arg_type,target_arg_info_t *arg_info,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  int local_40;
  int n_qwords;
  int n_fregs;
  int n_iregs;
  int n;
  MIR_type_t type;
  MIR_type_t *qword_types_local;
  target_arg_info_t *arg_info_local;
  type *arg_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  c2m_ctx_local._4_4_ = classify_arg(c2m_ctx,arg_type,qword_types,0);
  if (c2m_ctx_local._4_4_ == 0) {
    c2m_ctx_local._4_4_ = 0;
  }
  else if ((arg_type->mode == TM_STRUCT) || (arg_type->mode == TM_UNION)) {
    update_last_qword_type(c2m_ctx,arg_type,qword_types,c2m_ctx_local._4_4_);
    local_40 = 0;
    n_qwords = 0;
    for (n_fregs = 0; n_fregs < c2m_ctx_local._4_4_; n_fregs = n_fregs + 1) {
      MVar1 = qword_types[n_fregs];
      if ((((MVar1 == MIR_T_I8) || (MVar1 == MIR_T_I16)) || (MVar1 == MIR_T_I32)) ||
         (MVar1 == MIR_T_I64)) {
        n_qwords = n_qwords + 1;
      }
      else {
        if (1 < MVar1 - MIR_T_F) {
          if ((MVar1 != MIR_T_LD) && (MVar1 != 0x15)) {
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x141,
                          "int process_aggregate_arg(c2m_ctx_t, struct type *, target_arg_info_t *, MIR_type_t *)"
                         );
          }
          return 0;
        }
        local_40 = local_40 + 1;
      }
    }
    if ((arg_info->n_iregs + n_qwords < 7) && (arg_info->n_fregs + local_40 < 9)) {
      arg_info->n_iregs = n_qwords + arg_info->n_iregs;
      arg_info->n_fregs = local_40 + arg_info->n_fregs;
    }
    else {
      c2m_ctx_local._4_4_ = 0;
    }
  }
  else {
    c2m_ctx_local._4_4_ = 0;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int process_aggregate_arg (c2m_ctx_t c2m_ctx, struct type *arg_type,
                                  target_arg_info_t *arg_info, MIR_type_t qword_types[MAX_QWORDS]) {
  MIR_type_t type;
  int n, n_iregs, n_fregs, n_qwords = classify_arg (c2m_ctx, arg_type, qword_types, FALSE);

  if (n_qwords == 0) return 0;
  if (arg_type->mode != TM_STRUCT && arg_type->mode != TM_UNION) return 0;
  update_last_qword_type (c2m_ctx, arg_type, qword_types, n_qwords);
  n_iregs = n_fregs = 0;
  for (n = 0; n < n_qwords; n++) { /* start from the last qword */
    switch ((int) (type = qword_types[n])) {
    case MIR_T_I8:
    case MIR_T_I16:
    case MIR_T_I32:
    case MIR_T_I64: n_iregs++; break;
    case MIR_T_F:
    case MIR_T_D: n_fregs++; break;
    case X87UP_CLASS:
    case MIR_T_LD: return 0;
    default: assert (FALSE);
    }
  }
  if (arg_info->n_iregs + n_iregs > 6 || arg_info->n_fregs + n_fregs > 8) return 0;
  /* aggregate passed by value: update arg_info */
  arg_info->n_iregs += n_iregs;
  arg_info->n_fregs += n_fregs;
  return n_qwords;
}